

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

int __thiscall capnp::_::OrphanBuilder::truncate(OrphanBuilder *this,char *__file,__off_t __length)

{
  CapTableBuilder *capTable;
  PointerBuilder other;
  StructBuilder other_00;
  Fault FVar1;
  Fault FVar2;
  Fault FVar3;
  word *segment_00;
  bool bVar4;
  ElementSize size_00;
  unsigned_short data;
  unsigned_short pointers;
  Kind KVar5;
  WordCountN<29> WVar6;
  ElementCountN<29> EVar7;
  BitsPerElementTableType BVar8;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  unsigned_long uVar9;
  void **ppvVar10;
  void **ppvVar11;
  uint *puVar12;
  undefined7 extraout_var_02;
  ptrdiff_t pVar13;
  undefined7 extraout_var_03;
  undefined7 extraout_var_04;
  BuilderArena *pBVar14;
  OrphanBuilder *pOVar15;
  undefined7 extraout_var_05;
  undefined7 extraout_var_06;
  undefined7 extraout_var_07;
  undefined7 extraout_var_08;
  WordCount64 WVar16;
  WordCount64 WVar17;
  ByteCount64 BVar18;
  uchar *a;
  undefined7 extraout_var_09;
  undefined7 extraout_var_10;
  undefined7 extraout_var_11;
  undefined7 uVar19;
  WordCountN<29> local_2e8;
  WordCount64 words;
  ListBuilder newList_2;
  OrphanBuilder replacement_2;
  byte *oldEndByte;
  byte *newEndByte;
  byte *begin;
  word *oldEndWord_2;
  word *newEndWord_2;
  uint MAX_STEP_BYTES;
  BitsPerElementTableType step;
  ElementCountN<29> oldSize_2;
  CapTableBuilder *pCStack_258;
  WirePointer *local_250;
  PointerBuilder local_248;
  uint local_22c;
  Iterator local_228;
  uint i_2;
  Iterator __end6_1;
  Iterator __begin6_1;
  Range<unsigned_int> *__range6_1;
  WirePointer *oldPointers;
  ListBuilder newList_1;
  OrphanBuilder replacement_1;
  WirePointer *element_1;
  word *oldEndWord_1;
  word *newEndWord_1;
  ElementCountN<29> oldSize_1;
  uint POINTERS_PER_ELEMENT;
  CapTableBuilder *pCStack_198;
  void *local_190;
  WirePointer *pWStack_188;
  StructDataBitCount local_180;
  StructPointerCount SStack_17c;
  undefined2 uStack_17a;
  StructBuilder local_178;
  void **local_150;
  word *element;
  Iterator local_140;
  uint i_1;
  Iterator __end6;
  Iterator __begin6;
  Range<unsigned_int> *__range6;
  undefined1 local_120 [8];
  ListBuilder newList;
  undefined1 local_f0 [8];
  OrphanBuilder replacement;
  Fault f_2;
  word *expectedEnd;
  Iterator local_b8;
  uint i;
  Iterator __end4;
  Iterator __begin4;
  Range<unsigned_int> *__range4;
  word *oldEndWord;
  word *newEndWord;
  undefined4 local_88;
  anon_class_1_0_00000001 local_81;
  SegmentWordCount oldSizeWords;
  ListElementCount local_7c;
  SegmentWordCount sizeWords;
  ListElementCount oldSize;
  uint elementStep;
  StructSize structSize;
  Fault f_1;
  WirePointer *tag;
  anon_class_1_0_00000001 local_55;
  WordCountN<29> oldWordCount;
  ElementSize elementSize;
  Fault local_48;
  Fault f;
  word *target;
  SegmentBuilder *segment;
  WirePointer *ref;
  byte local_1d;
  ListElementCount size;
  bool isText_local;
  OrphanBuilder *pOStack_18;
  ElementCount uncheckedSize_local;
  OrphanBuilder *this_local;
  
  size = (ListElementCount)__file;
  local_1d = (byte)__length & 1;
  pOStack_18 = this;
  ref._4_4_ = assertMaxBits<29u,unsigned_int,capnp::_::OrphanBuilder::truncate(unsigned_int,bool)::__0>
                        (size,(anon_class_1_0_00000001 *)((long)&ref + 3));
  segment = (SegmentBuilder *)tagAsPtr(this);
  target = (word *)this->segment;
  f.exception = (Exception *)
                WireHelpers::followFars
                          ((WirePointer **)&segment,this->location,(SegmentBuilder **)&target);
  bVar4 = WirePointer::isNull((WirePointer *)segment);
  if (bVar4) {
    this_local._7_1_ = ref._4_4_ == 0;
    uVar19 = extraout_var;
  }
  else {
    KVar5 = WirePointer::kind((WirePointer *)segment);
    if (KVar5 == LIST) {
      if ((local_1d & 1) != 0) {
        ref._4_4_ = assertMaxBits<29u,unsigned_int,capnp::_::OrphanBuilder::truncate(unsigned_int,bool)::__1>
                              (ref._4_4_ + 1,&local_55);
      }
      size_00 = WirePointer::ListRef::elementSize
                          ((ListRef *)((long)&(segment->super_SegmentReader).arena + 4));
      if (size_00 == INLINE_COMPOSITE) {
        WVar6 = WirePointer::ListRef::inlineCompositeWordCount
                          ((ListRef *)((long)&(segment->super_SegmentReader).arena + 4));
        FVar1 = f;
        f.exception = (Exception *)&((f.exception)->ownFile).content.size_;
        KVar5 = WirePointer::kind((WirePointer *)FVar1.exception);
        if (KVar5 != STRUCT) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[61]>
                    ((Fault *)&elementStep,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                     ,0xe4e,FAILED,"tag->kind() == WirePointer::STRUCT",
                     "\"INLINE_COMPOSITE lists of non-STRUCT type are not supported.\"",
                     (char (*) [61])"INLINE_COMPOSITE lists of non-STRUCT type are not supported.");
          this_local._7_1_ = 0;
          kj::_::Debug::Fault::~Fault((Fault *)&elementStep);
          uVar19 = extraout_var_01;
          goto LAB_004595f1;
        }
        data = DirectWireValue<unsigned_short>::get
                         ((DirectWireValue<unsigned_short> *)
                          ((long)&((FVar1.exception)->ownFile).content.ptr + 4));
        pointers = DirectWireValue<unsigned_short>::get
                             ((DirectWireValue<unsigned_short> *)
                              ((long)&((FVar1.exception)->ownFile).content.ptr + 6));
        StructSize::StructSize((StructSize *)&oldSize,data,pointers);
        sizeWords = StructSize::total((StructSize *)&oldSize);
        local_7c = WirePointer::inlineCompositeListElementCount((WirePointer *)FVar1.exception);
        uVar9 = upgradeBound<unsigned_long,unsigned_int>(ref._4_4_);
        uVar9 = assertMaxBits<29u,unsigned_long,capnp::_::OrphanBuilder::truncate(unsigned_int,bool)::__2>
                          (uVar9 * sizeWords,&local_81);
        oldSizeWords = (SegmentWordCount)uVar9;
        uVar9 = upgradeBound<unsigned_long,unsigned_int>(local_7c);
        uVar9 = assertMaxBits<29u,unsigned_long,capnp::_::OrphanBuilder::truncate(unsigned_int,bool)::__3>
                          (uVar9 * sizeWords,(anon_class_1_0_00000001 *)((long)&newEndWord + 7));
        local_88 = (undefined4)uVar9;
        ppvVar10 = (f.exception)->trace + ((ulong)oldSizeWords - 10);
        ppvVar11 = (f.exception)->trace + ((ulong)WVar6 - 10);
        if (local_7c < ref._4_4_) {
          if (ppvVar11 < ppvVar10) {
            bVar4 = SegmentBuilder::tryExtend
                              ((SegmentBuilder *)target,(word *)ppvVar11,(word *)ppvVar10);
            if (bVar4) {
              WirePointer::ListRef::setInlineComposite
                        ((ListRef *)((long)&(segment->super_SegmentReader).arena + 4),oldSizeWords);
              WirePointer::setKindAndInlineCompositeListElementCount
                        ((WirePointer *)FVar1.exception,STRUCT,ref._4_4_);
              uVar19 = extraout_var_04;
            }
            else {
              pBVar14 = SegmentBuilder::getArena((SegmentBuilder *)target);
              newList.structPointerCount = (ushort)oldSize;
              newList.elementSize = oldSize._2_1_;
              newList._39_1_ = oldSize._3_1_;
              initStructList((OrphanBuilder *)local_f0,pBVar14,this->capTable,ref._4_4_,
                             (StructSize)oldSize);
              asStructList((ListBuilder *)local_120,(OrphanBuilder *)local_f0,(StructSize)oldSize);
              ___end6 = kj::zeroTo<unsigned_int>(local_7c);
              i_1 = (uint)kj::Range<unsigned_int>::begin((Range<unsigned_int> *)&__end6);
              local_140 = kj::Range<unsigned_int>::end((Range<unsigned_int> *)&__end6);
              while (bVar4 = kj::Range<unsigned_int>::Iterator::operator!=
                                       ((Iterator *)&i_1,&local_140), bVar4) {
                puVar12 = kj::Range<unsigned_int>::Iterator::operator*((Iterator *)&i_1);
                FVar1 = f;
                element._4_4_ = *puVar12;
                uVar9 = upgradeBound<unsigned_long,unsigned_int>(element._4_4_);
                uVar9 = assumeBits<29u,unsigned_long>(uVar9 * sizeWords);
                local_150 = (FVar1.exception)->trace + (uVar9 - 10);
                ListBuilder::getStructElement(&local_178,(ListBuilder *)local_120,element._4_4_);
                StructBuilder::StructBuilder
                          ((StructBuilder *)&oldSize_1,(SegmentBuilder *)target,this->capTable,
                           local_150,(WirePointer *)(local_150 + (ushort)oldSize),
                           (oldSize & 0xffff) << 6,oldSize._2_2_);
                other_00.capTable = pCStack_198;
                other_00.segment = _oldSize_1;
                other_00.data = local_190;
                other_00.pointers = pWStack_188;
                other_00.dataSize = local_180;
                other_00.pointerCount = SStack_17c;
                other_00._38_2_ = uStack_17a;
                StructBuilder::transferContentFrom(&local_178,other_00);
                kj::Range<unsigned_int>::Iterator::operator++((Iterator *)&i_1);
              }
              pOVar15 = kj::mv<capnp::_::OrphanBuilder>((OrphanBuilder *)local_f0);
              operator=(this,pOVar15);
              ~OrphanBuilder((OrphanBuilder *)local_f0);
              uVar19 = extraout_var_05;
            }
          }
          else {
            ppvVar11 = (f.exception)->trace + ((uVar9 & 0xffffffff) - 10);
            if (ppvVar10 < ppvVar11) {
              kj::_::Debug::Fault::Fault
                        ((Fault *)&replacement.location,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                         ,0xe70,FAILED,"newEndWord >= expectedEnd","");
              kj::_::Debug::Fault::fatal((Fault *)&replacement.location);
            }
            pVar13 = intervalLength<capnp::word>((word *)ppvVar11,(word *)ppvVar10,0x1fffffff);
            WireHelpers::zeroMemory((word *)ppvVar11,(WordCountN<29>)pVar13);
            WirePointer::setKindAndInlineCompositeListElementCount
                      ((WirePointer *)FVar1.exception,STRUCT,ref._4_4_);
            uVar19 = extraout_var_03;
          }
        }
        else {
          ___end4 = kj::range<unsigned_int>(ref._4_4_,local_7c);
          i = (uint)kj::Range<unsigned_int>::begin((Range<unsigned_int> *)&__end4);
          local_b8 = kj::Range<unsigned_int>::end((Range<unsigned_int> *)&__end4);
          while (bVar4 = kj::Range<unsigned_int>::Iterator::operator!=((Iterator *)&i,&local_b8),
                bVar4) {
            puVar12 = kj::Range<unsigned_int>::Iterator::operator*((Iterator *)&i);
            segment_00 = target;
            FVar2 = f;
            capTable = this->capTable;
            uVar9 = upgradeBound<unsigned_long,unsigned_int>(*puVar12);
            uVar9 = assumeBits<29u,unsigned_long>(uVar9 * sizeWords);
            WireHelpers::zeroObject
                      ((SegmentBuilder *)segment_00,capTable,(WirePointer *)FVar1.exception,
                       (word *)((FVar2.exception)->trace + (uVar9 - 10)));
            kj::Range<unsigned_int>::Iterator::operator++((Iterator *)&i);
          }
          WirePointer::ListRef::setInlineComposite
                    ((ListRef *)((long)&(segment->super_SegmentReader).arena + 4),oldSizeWords);
          WirePointer::setKindAndInlineCompositeListElementCount
                    ((WirePointer *)FVar1.exception,STRUCT,ref._4_4_);
          SegmentBuilder::tryTruncate((SegmentBuilder *)target,(word *)ppvVar11,(word *)ppvVar10);
          uVar19 = extraout_var_02;
        }
      }
      else if (size_00 == POINTER) {
        EVar7 = WirePointer::ListRef::elementCount
                          ((ListRef *)((long)&(segment->super_SegmentReader).arena + 4));
        ppvVar10 = (f.exception)->trace + ((ulong)ref._4_4_ - 10);
        ppvVar11 = (f.exception)->trace + ((ulong)EVar7 - 10);
        replacement_1.location = (word *)ppvVar10;
        if (EVar7 < ref._4_4_) {
          bVar4 = SegmentBuilder::tryExtend
                            ((SegmentBuilder *)target,(word *)ppvVar11,(word *)ppvVar10);
          if (bVar4) {
            WirePointer::ListRef::set
                      ((ListRef *)((long)&(segment->super_SegmentReader).arena + 4),POINTER,
                       ref._4_4_);
            uVar19 = extraout_var_07;
          }
          else {
            pBVar14 = SegmentBuilder::getArena((SegmentBuilder *)target);
            initList((OrphanBuilder *)&newList_1.structDataSize,pBVar14,this->capTable,ref._4_4_,
                     POINTER);
            asList((ListBuilder *)&oldPointers,(OrphanBuilder *)&newList_1.structDataSize,POINTER);
            FVar1 = f;
            ___end6_1 = kj::zeroTo<unsigned_int>(EVar7);
            i_2 = (uint)kj::Range<unsigned_int>::begin((Range<unsigned_int> *)&__end6_1);
            local_228 = kj::Range<unsigned_int>::end((Range<unsigned_int> *)&__end6_1);
            while (bVar4 = kj::Range<unsigned_int>::Iterator::operator!=
                                     ((Iterator *)&i_2,&local_228), bVar4) {
              puVar12 = kj::Range<unsigned_int>::Iterator::operator*((Iterator *)&i_2);
              local_22c = *puVar12;
              ListBuilder::getPointerElement(&local_248,(ListBuilder *)&oldPointers,local_22c);
              PointerBuilder::PointerBuilder
                        ((PointerBuilder *)&step,(SegmentBuilder *)target,this->capTable,
                         (WirePointer *)((FVar1.exception)->trace + ((ulong)local_22c - 10)));
              other.capTable = pCStack_258;
              other.segment = _step;
              other.pointer = local_250;
              PointerBuilder::transferFrom(&local_248,other);
              kj::Range<unsigned_int>::Iterator::operator++((Iterator *)&i_2);
            }
            pOVar15 = kj::mv<capnp::_::OrphanBuilder>((OrphanBuilder *)&newList_1.structDataSize);
            operator=(this,pOVar15);
            ~OrphanBuilder((OrphanBuilder *)&newList_1.structDataSize);
            uVar19 = extraout_var_08;
          }
        }
        else {
          for (; replacement_1.location < ppvVar11;
              replacement_1.location = replacement_1.location + 1) {
            WireHelpers::zeroPointerAndFars
                      ((SegmentBuilder *)target,(WirePointer *)replacement_1.location);
          }
          WirePointer::ListRef::set
                    ((ListRef *)((long)&(segment->super_SegmentReader).arena + 4),POINTER,ref._4_4_)
          ;
          SegmentBuilder::tryTruncate((SegmentBuilder *)target,(word *)ppvVar11,(word *)ppvVar10);
          uVar19 = extraout_var_06;
        }
      }
      else {
        EVar7 = WirePointer::ListRef::elementCount
                          ((ListRef *)((long)&(segment->super_SegmentReader).arena + 4));
        BVar8 = dataBitsPerElement(size_00);
        FVar1 = f;
        uVar9 = upgradeBound<unsigned_long,unsigned_int>(ref._4_4_);
        WVar16 = WireHelpers::roundBitsUpToWords(uVar9 * BVar8);
        FVar2 = f;
        uVar9 = upgradeBound<unsigned_long,unsigned_int>(EVar7);
        WVar17 = WireHelpers::roundBitsUpToWords(uVar9 * BVar8);
        FVar3 = f;
        ppvVar10 = (FVar2.exception)->trace + (WVar17 - 10);
        if (EVar7 < ref._4_4_) {
          bVar4 = SegmentBuilder::tryExtend
                            ((SegmentBuilder *)target,(word *)ppvVar10,
                             (word *)((FVar1.exception)->trace + (WVar16 - 10)));
          if (bVar4) {
            WirePointer::ListRef::set
                      ((ListRef *)((long)&(segment->super_SegmentReader).arena + 4),size_00,
                       ref._4_4_);
            uVar19 = extraout_var_10;
          }
          else {
            pBVar14 = SegmentBuilder::getArena((SegmentBuilder *)target);
            initList((OrphanBuilder *)&newList_2.structDataSize,pBVar14,this->capTable,ref._4_4_,
                     size_00);
            asList((ListBuilder *)&words,(OrphanBuilder *)&newList_2.structDataSize,size_00);
            BVar8 = dataBitsPerElement(size_00);
            uVar9 = upgradeBound<unsigned_long,unsigned_int>(EVar7);
            WVar16 = WireHelpers::roundBitsUpToWords(BVar8 * uVar9);
            local_2e8 = (WordCountN<29>)WVar16;
            WireHelpers::copyMemory((word *)newList_2.capTable,(word *)f.exception,local_2e8);
            pOVar15 = kj::mv<capnp::_::OrphanBuilder>((OrphanBuilder *)&newList_2.structDataSize);
            operator=(this,pOVar15);
            ~OrphanBuilder((OrphanBuilder *)&newList_2.structDataSize);
            uVar19 = extraout_var_11;
          }
        }
        else {
          uVar9 = upgradeBound<unsigned_long,unsigned_int>(ref._4_4_);
          BVar18 = WireHelpers::roundBitsUpToBytes(uVar9 * BVar8);
          a = (uchar *)((long)FVar3.exception + (BVar18 - (long)(int)(uint)(local_1d & 1)));
          pVar13 = intervalLength<unsigned_char>(a,(uchar *)ppvVar10,0xfffffff8);
          WireHelpers::zeroMemory(a,(ByteCount32)pVar13);
          WirePointer::ListRef::set
                    ((ListRef *)((long)&(segment->super_SegmentReader).arena + 4),size_00,ref._4_4_)
          ;
          SegmentBuilder::tryTruncate
                    ((SegmentBuilder *)target,(word *)ppvVar10,
                     (word *)((FVar1.exception)->trace + (WVar16 - 10)));
          uVar19 = extraout_var_09;
        }
      }
      this_local._7_1_ = 1;
    }
    else {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[25]>
                (&local_48,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0xe3c,FAILED,"ref->kind() == WirePointer::LIST","\"Can\'t truncate non-list.\"",
                 (char (*) [25])"Can\'t truncate non-list.");
      this_local._7_1_ = 0;
      kj::_::Debug::Fault::~Fault(&local_48);
      uVar19 = extraout_var_00;
    }
  }
LAB_004595f1:
  return (uint)CONCAT71(uVar19,this_local._7_1_) & 0xffffff01;
}

Assistant:

bool OrphanBuilder::truncate(ElementCount uncheckedSize, bool isText) {
  ListElementCount size = assertMaxBits<LIST_ELEMENT_COUNT_BITS>(uncheckedSize,
      []() { KJ_FAIL_REQUIRE("requested list size is too large"); });

  WirePointer* ref = tagAsPtr();
  SegmentBuilder* segment = this->segment;

  word* target = WireHelpers::followFars(ref, location, segment);

  if (ref->isNull()) {
    // We don't know the right element size, so we can't resize this list.
    return size == ZERO * ELEMENTS;
  }

  KJ_REQUIRE(ref->kind() == WirePointer::LIST, "Can't truncate non-list.") {
    return false;
  }

  if (isText) {
    // Add space for the NUL terminator.
    size = assertMaxBits<LIST_ELEMENT_COUNT_BITS>(size + ONE * ELEMENTS,
        []() { KJ_FAIL_REQUIRE("requested list size is too large"); });
  }

  auto elementSize = ref->listRef.elementSize();

  if (elementSize == ElementSize::INLINE_COMPOSITE) {
    auto oldWordCount = ref->listRef.inlineCompositeWordCount();

    WirePointer* tag = reinterpret_cast<WirePointer*>(target);
    ++target;
    KJ_REQUIRE(tag->kind() == WirePointer::STRUCT,
               "INLINE_COMPOSITE lists of non-STRUCT type are not supported.") {
      return false;
    }
    StructSize structSize(tag->structRef.dataSize.get(), tag->structRef.ptrCount.get());
    auto elementStep = structSize.total() / ELEMENTS;

    auto oldSize = tag->inlineCompositeListElementCount();

    SegmentWordCount sizeWords = assertMaxBits<SEGMENT_WORD_COUNT_BITS>(
        upgradeBound<uint64_t>(size) * elementStep,
        []() { KJ_FAIL_ASSERT("requested list size too large to fit in message segment"); });
    SegmentWordCount oldSizeWords = assertMaxBits<SEGMENT_WORD_COUNT_BITS>(
        upgradeBound<uint64_t>(oldSize) * elementStep,
        []() { KJ_FAIL_ASSERT("prior to truncate, list is larger than max segment size?"); });

    word* newEndWord = target + sizeWords;
    word* oldEndWord = target + oldWordCount;

    if (size <= oldSize) {
      // Zero the trailing elements.
      for (auto i: kj::range(size, oldSize)) {
        // assumeBits() safe because we checked that both sizeWords and oldSizeWords are in-range
        // above.
        WireHelpers::zeroObject(segment, capTable, tag, target +
            assumeBits<SEGMENT_WORD_COUNT_BITS>(upgradeBound<uint64_t>(i) * elementStep));
      }
      ref->listRef.setInlineComposite(sizeWords);
      tag->setKindAndInlineCompositeListElementCount(WirePointer::STRUCT, size);
      segment->tryTruncate(oldEndWord, newEndWord);
    } else if (newEndWord <= oldEndWord) {
      // Apparently the old list was over-allocated? The word count is more than needed to store
      // the elements. This is "valid" but shouldn't happen in practice unless someone is toying
      // with us.
      word* expectedEnd = target + oldSizeWords;
      KJ_ASSERT(newEndWord >= expectedEnd);
      WireHelpers::zeroMemory(expectedEnd,
          intervalLength(expectedEnd, newEndWord, MAX_SEGMENT_WORDS));
      tag->setKindAndInlineCompositeListElementCount(WirePointer::STRUCT, size);
    } else {
      if (segment->tryExtend(oldEndWord, newEndWord)) {
        // Done in-place. Nothing else to do now; the new memory is already zero'd.
        ref->listRef.setInlineComposite(sizeWords);
        tag->setKindAndInlineCompositeListElementCount(WirePointer::STRUCT, size);
      } else {
        // Need to re-allocate and transfer.
        OrphanBuilder replacement = initStructList(segment->getArena(), capTable, size, structSize);

        ListBuilder newList = replacement.asStructList(structSize);
        for (auto i: kj::zeroTo(oldSize)) {
          // assumeBits() safe because we checked that both sizeWords and oldSizeWords are in-range
          // above.
          word* element = target +
              assumeBits<SEGMENT_WORD_COUNT_BITS>(upgradeBound<uint64_t>(i) * elementStep);
          newList.getStructElement(i).transferContentFrom(
              StructBuilder(segment, capTable, element,
                            reinterpret_cast<WirePointer*>(element + structSize.data),
                            structSize.data * BITS_PER_WORD, structSize.pointers));
        }

        *this = kj::mv(replacement);
      }
    }
  } else if (elementSize == ElementSize::POINTER) {
    // TODO(cleanup): GCC won't let me declare this constexpr, claiming POINTERS is not constexpr,
    //   but it is?
    const auto POINTERS_PER_ELEMENT = ONE * POINTERS / ELEMENTS;

    auto oldSize = ref->listRef.elementCount();
    word* newEndWord = target + size * POINTERS_PER_ELEMENT * WORDS_PER_POINTER;
    word* oldEndWord = target + oldSize * POINTERS_PER_ELEMENT * WORDS_PER_POINTER;

    if (size <= oldSize) {
      // Zero the trailing elements.
      for (WirePointer* element = reinterpret_cast<WirePointer*>(newEndWord);
           element < reinterpret_cast<WirePointer*>(oldEndWord); ++element) {
        WireHelpers::zeroPointerAndFars(segment, element);
      }
      ref->listRef.set(ElementSize::POINTER, size);
      segment->tryTruncate(oldEndWord, newEndWord);
    } else {
      if (segment->tryExtend(oldEndWord, newEndWord)) {
        // Done in-place. Nothing else to do now; the new memory is already zero'd.
        ref->listRef.set(ElementSize::POINTER, size);
      } else {
        // Need to re-allocate and transfer.
        OrphanBuilder replacement = initList(
            segment->getArena(), capTable, size, ElementSize::POINTER);
        ListBuilder newList = replacement.asList(ElementSize::POINTER);
        WirePointer* oldPointers = reinterpret_cast<WirePointer*>(target);
        for (auto i: kj::zeroTo(oldSize)) {
          newList.getPointerElement(i).transferFrom(
              PointerBuilder(segment, capTable, oldPointers + i * POINTERS_PER_ELEMENT));
        }
        *this = kj::mv(replacement);
      }
    }
  } else {
    auto oldSize = ref->listRef.elementCount();
    auto step = dataBitsPerElement(elementSize);
    const auto MAX_STEP_BYTES = ONE * WORDS / ELEMENTS * BYTES_PER_WORD;
    word* newEndWord = target + WireHelpers::roundBitsUpToWords(
        upgradeBound<uint64_t>(size) * step);
    word* oldEndWord = target + WireHelpers::roundBitsUpToWords(
        upgradeBound<uint64_t>(oldSize) * step);

    if (size <= oldSize) {
      // When truncating text, we want to set the null terminator as well, so we'll do our zeroing
      // at the byte level.
      byte* begin = reinterpret_cast<byte*>(target);
      byte* newEndByte = begin + WireHelpers::roundBitsUpToBytes(
          upgradeBound<uint64_t>(size) * step) - isText;
      byte* oldEndByte = reinterpret_cast<byte*>(oldEndWord);

      WireHelpers::zeroMemory(newEndByte,
          intervalLength(newEndByte, oldEndByte, MAX_LIST_ELEMENTS * MAX_STEP_BYTES));
      ref->listRef.set(elementSize, size);
      segment->tryTruncate(oldEndWord, newEndWord);
    } else {
      // We're trying to extend, not truncate.
      if (segment->tryExtend(oldEndWord, newEndWord)) {
        // Done in-place. Nothing else to do now; the memory is already zero'd.
        ref->listRef.set(elementSize, size);
      } else {
        // Need to re-allocate and transfer.
        OrphanBuilder replacement = initList(segment->getArena(), capTable, size, elementSize);
        ListBuilder newList = replacement.asList(elementSize);
        auto words = WireHelpers::roundBitsUpToWords(
            dataBitsPerElement(elementSize) * upgradeBound<uint64_t>(oldSize));
        WireHelpers::copyMemory(reinterpret_cast<word*>(newList.ptr), target, words);
        *this = kj::mv(replacement);
      }
    }
  }

  return true;
}